

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel_p.h
# Opt level: O0

size_t QtPrivate::qHash(QModelIndexWrapper *index,size_t seed)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int *args;
  QHashMultiReturnType<int,_int,_unsigned_long_long> QVar4;
  unsigned_long_long *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QModelIndex::row(in_RDI);
  iVar3 = QModelIndex::column(in_RDI);
  args = (int *)QModelIndex::internalId(in_RDI);
  QVar4 = qHashMulti<int,int,unsigned_long_long>(CONCAT44(iVar2,iVar3),args,&in_RDI->r,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

inline size_t qHash(const QtPrivate::QModelIndexWrapper &index, size_t seed = 0) noexcept
    {
        return qHashMulti(seed, index.index.row(), index.index.column(), index.index.internalId());
    }